

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Rsa.cpp
# Opt level: O0

bool __thiscall
axl::cry::Rsa::generate(Rsa *this,uint_t keyLength,uint_t publicExponent,BN_GENCB *callback)

{
  bool bVar1;
  bignum_st *publicExponent_00;
  undefined4 in_ESI;
  BigNum *in_RDI;
  BigNum bigNum;
  undefined2 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaa;
  byte bVar2;
  undefined1 in_stack_ffffffffffffffab;
  undefined4 in_stack_ffffffffffffffac;
  BigNum *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffbc;
  Handle local_20 [20];
  undefined4 local_c;
  
  local_c = in_ESI;
  BigNum::BigNum(in_RDI);
  bVar1 = BigNum::create(in_stack_ffffffffffffffb0);
  in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
  if (bVar1) {
    bVar1 = BigNum::setWord(in_stack_ffffffffffffffb0,
                            CONCAT44(in_stack_ffffffffffffffac,
                                     CONCAT13(in_stack_ffffffffffffffab,
                                              CONCAT12(in_stack_ffffffffffffffaa,
                                                       in_stack_ffffffffffffffa8))));
    in_stack_ffffffffffffffbc = (uint)CONCAT12(bVar1,(short)in_stack_ffffffffffffffbc);
    if (bVar1) {
      publicExponent_00 = sl::Handle::operator_cast_to_bignum_st_(local_20);
      bVar1 = generate((Rsa *)in_RDI,in_stack_ffffffffffffffbc,publicExponent_00,
                       (BN_GENCB *)
                       CONCAT44(local_c,CONCAT13(in_stack_ffffffffffffffab,
                                                 CONCAT12(in_stack_ffffffffffffffaa,
                                                          in_stack_ffffffffffffffa8))));
      in_stack_ffffffffffffffbc = (uint)bVar1 << 0x18;
    }
  }
  bVar2 = (byte)(in_stack_ffffffffffffffbc >> 0x18);
  BigNum::~BigNum((BigNum *)0x15122a);
  return (bool)(bVar2 & 1);
}

Assistant:

bool
Rsa::generate(
	uint_t keyLength,
	uint_t publicExponent,
	BN_GENCB* callback
) {
	BigNum bigNum;

	return
		bigNum.create() &&
		bigNum.setWord(publicExponent) &&
		generate(keyLength, bigNum, callback);
}